

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O0

tommy_tree_node * tommy_tree_balance(tommy_tree_node *root)

{
  long lVar1;
  int iVar2;
  tommy_tree_node *ptVar3;
  long in_FS_OFFSET;
  int delta;
  tommy_tree_node *root_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = tommy_tree_delta(root);
  if (iVar2 < -1) {
    iVar2 = tommy_tree_delta(root->next);
    if (0 < iVar2) {
      ptVar3 = tommy_tree_rotate_right(root->next);
      root->next = ptVar3;
    }
    root_local = tommy_tree_rotate_left(root);
  }
  else if (iVar2 < 2) {
    root->key = 0;
    if ((root->prev != (tommy_node_struct *)0x0) && (root->key < root->prev->key)) {
      root->key = root->prev->key;
    }
    if ((root->next != (tommy_node_struct *)0x0) && (root->key < root->next->key)) {
      root->key = root->next->key;
    }
    root->key = root->key + 1;
    root_local = root;
  }
  else {
    iVar2 = tommy_tree_delta(root->prev);
    if (iVar2 < 0) {
      ptVar3 = tommy_tree_rotate_left(root->prev);
      root->prev = ptVar3;
    }
    root_local = tommy_tree_rotate_right(root);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return root_local;
  }
  __stack_chk_fail();
}

Assistant:

static tommy_tree_node* tommy_tree_balance(tommy_tree_node* root)
{
	int delta = tommy_tree_delta(root);

	if (delta < -1) {
		if (tommy_tree_delta(root->next) > 0)
			root->next = tommy_tree_rotate_right(root->next);
		return tommy_tree_rotate_left(root);
	}

	if (delta > 1) {
		if (tommy_tree_delta(root->prev) < 0)
			root->prev = tommy_tree_rotate_left(root->prev);
		return tommy_tree_rotate_right(root);
	}

	/* recompute key */
	root->key = 0;

	if (root->prev && root->prev->key > root->key)
		root->key = root->prev->key;

	if (root->next && root->next->key > root->key)
		root->key = root->next->key;

	/* count itself */
	root->key += 1;

	return root;
}